

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Gia_ManDomTest(Gia_Man_t *p)

{
  int iVar1;
  void *__ptr;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *vSupp;
  Vec_Wec_t *__ptr_00;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar3 = (int *)malloc(400);
  vSupp->pArray = piVar3;
  __ptr_00 = Gia_ManCreateSupps(p,1);
  iVar1 = p->nObjs;
  piVar3 = (int *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  *piVar3 = iVar6;
  if (iVar6 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = calloc((long)iVar6,0x10);
  }
  *(void **)(piVar3 + 2) = pvVar4;
  piVar3[1] = iVar1;
  Gia_ManCreateRefs(p);
  Gia_ManComputeDoms(p);
  pVVar9 = p->vCis;
  if (pVVar9->nSize < 1) {
    uVar5 = (ulong)(uint)p->nObjs;
  }
  else {
    lVar10 = 0;
    do {
      iVar6 = pVVar9->pArray[lVar10];
      if ((long)iVar6 < 0) goto LAB_00624770;
      uVar11 = p->nObjs;
      uVar5 = (ulong)uVar11;
      if ((int)uVar11 <= iVar6) goto LAB_00624770;
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) goto LAB_006244ca;
      if (p->vDoms->nSize <= iVar6) {
LAB_00624751:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = p->vDoms->pArray[iVar6];
      uVar12 = (ulong)uVar2;
      if (uVar12 != 0xffffffff) {
        if (((int)uVar2 < 0) || (uVar11 <= uVar2)) goto LAB_00624770;
        if ((~*(uint *)(pGVar7 + uVar12) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar7 + uVar12))
        {
          pGVar13 = pGVar7 + uVar12;
          do {
            if ((pGVar13 < pGVar7) || (pGVar7 + (int)uVar5 <= pGVar13)) {
LAB_00624732:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar11 = (int)((long)pGVar13 - (long)pGVar7 >> 2) * -0x55555555;
            if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_0062478f;
            Vec_IntPush((Vec_Int_t *)((ulong)(uVar11 & 0x7fffffff) * 0x10 + (long)pvVar4),
                        (int)lVar10);
            pGVar7 = p->pObjs;
            if (pGVar13 < pGVar7) goto LAB_00624732;
            uVar5 = (ulong)p->nObjs;
            if (pGVar7 + uVar5 <= pGVar13) goto LAB_00624732;
            uVar11 = (int)((long)pGVar13 - (long)pGVar7 >> 2) * -0x55555555;
            if (((int)uVar11 < 0) || (p->vDoms->nSize <= (int)uVar11)) goto LAB_00624751;
            iVar6 = p->vDoms->pArray[uVar11 & 0x7fffffff];
            lVar8 = (long)iVar6;
            if ((lVar8 < 0) || (p->nObjs <= iVar6)) goto LAB_00624770;
          } while ((-1 < (int)(uint)*(undefined8 *)(pGVar7 + lVar8)) &&
                  (pGVar13 = pGVar7 + lVar8,
                  ((uint)*(undefined8 *)(pGVar7 + lVar8) & 0x1fffffff) != 0x1fffffff));
          pVVar9 = p->vCis;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar9->nSize);
  }
  if (0 < (int)uVar5) {
LAB_006244ca:
    lVar10 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar11 = *(uint *)(p->pObjs + lVar10);
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        if ((__ptr_00->nSize <= lVar10) || (piVar3[1] <= lVar10)) {
LAB_0062478f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar11 = __ptr_00->pArray[lVar10].nSize;
        if (uVar11 == *(uint *)(*(long *)(piVar3 + 2) + 4 + lVar10 * 0x10)) {
          if (0 < (int)uVar11) {
            uVar12 = 0;
            do {
              if (__ptr_00->pArray[lVar10].pArray[uVar12] !=
                  *(int *)(*(long *)(*(long *)(piVar3 + 2) + lVar10 * 0x10 + 8) + uVar12 * 4))
              goto LAB_0062455c;
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          Vec_IntPush(p_00,(int)lVar10);
          uVar5 = (ulong)(uint)p->nObjs;
        }
      }
LAB_0062455c:
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar5);
  }
  iVar1 = __ptr_00->nCap;
  pVVar9 = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (pVVar9 != (Vec_Int_t *)0x0) goto LAB_006245a8;
  }
  else {
    lVar10 = 0;
    do {
      pvVar4 = *(void **)((long)&pVVar9->pArray + lVar10);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pVVar9->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar10);
LAB_006245a8:
    free(pVVar9);
  }
  free(__ptr_00);
  iVar1 = *piVar3;
  pvVar4 = *(void **)(piVar3 + 2);
  if ((long)iVar1 < 1) {
    if (pvVar4 != (void *)0x0) goto LAB_006245f6;
  }
  else {
    lVar10 = 0;
    do {
      __ptr = *(void **)((long)pvVar4 + lVar10 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar4 + lVar10 + 8) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar10);
LAB_006245f6:
    free(pvVar4);
  }
  free(piVar3);
  iVar1 = p_00->nSize;
  lVar10 = (long)iVar1;
  if (lVar10 < 1) {
LAB_006246e7:
    putchar(10);
    piVar3 = p_00->pArray;
LAB_006246f5:
    if (piVar3 == (int *)0x0) goto LAB_006246ff;
  }
  else {
    piVar3 = p_00->pArray;
    lVar8 = 0;
    do {
      iVar6 = piVar3[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00624770;
      p->pRefs[iVar6] = p->pRefs[iVar6] + 1;
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
    if (iVar1 < 1) goto LAB_006246e7;
    piVar3 = p_00->pArray;
    lVar8 = 0;
    do {
      uVar11 = piVar3[lVar8];
      if (((long)(int)uVar11 < 0) || (p->nObjs <= (int)uVar11)) goto LAB_00624770;
      uVar2 = Gia_NodeMffcSizeSupp(p,p->pObjs + (int)uVar11,vSupp);
      printf("%d(%d:%d) ",(ulong)uVar11,(ulong)(uint)vSupp->nSize,(ulong)uVar2);
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
    putchar(10);
    piVar3 = p_00->pArray;
    if (iVar1 < 1) goto LAB_006246f5;
    lVar8 = 0;
    do {
      iVar1 = piVar3[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00624770:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p->pRefs[iVar1] = p->pRefs[iVar1] + -1;
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
  }
  free(piVar3);
LAB_006246ff:
  free(p_00);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  return;
}

Assistant:

void Gia_ManDomTest( Gia_Man_t * p )
{
    Vec_Int_t * vDoms = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wec_t * vSupps = Gia_ManCreateSupps( p, 1 );
    Vec_Wec_t * vDomeds = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pDom; int i, Id, nMffcSize;
    Gia_ManCreateRefs( p );
    Gia_ManComputeDoms( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        if ( Gia_ObjDom(p, pObj) == -1 )
            continue;
        for ( pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj)); Gia_ObjIsAnd(pDom); pDom = Gia_ManObj(p, Gia_ObjDom(p, pDom)) )
            Vec_IntPush( Vec_WecEntry(vDomeds, Gia_ObjId(p, pDom)), i );
    }
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEqual(Vec_WecEntry(vSupps, i), Vec_WecEntry(vDomeds, i)) )
            Vec_IntPush( vDoms, i );
    Vec_WecFree( vSupps );
    Vec_WecFree( vDomeds );

    // check MFFC sizes
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefInc( p, Gia_ManObj(p, Id) );
    Vec_IntForEachEntry( vDoms, Id, i )
    {
        nMffcSize = Gia_NodeMffcSizeSupp( p, Gia_ManObj(p, Id), vSupp );
        printf( "%d(%d:%d) ", Id, Vec_IntSize(vSupp), nMffcSize );
    }
    printf( "\n" );
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefDec( p, Gia_ManObj(p, Id) );

//    Vec_IntPrint( vDoms );
    Vec_IntFree( vDoms );
    Vec_IntFree( vSupp );
}